

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O1

void czh::utils::digit_gen(DiyFp W,DiyFp Mp,DiyFp delta,string *buffer,int *K)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  ulong delta_00;
  ulong rest;
  long lVar5;
  ulong rest_00;
  int iVar6;
  uint64_t ten_kappa;
  DiyFp DVar7;
  DiyFp local_50;
  DiyFp local_40;
  
  delta_00 = delta.f;
  local_50.f = Mp.f;
  local_40.f = W.f;
  local_50.e = Mp.e;
  local_40.e = W.e;
  bVar3 = -(char)Mp.e;
  ten_kappa = 1L << (bVar3 & 0x3f);
  DVar7 = DiyFp::operator-(&local_50,&local_40);
  uVar4 = local_50.f >> (bVar3 & 0x3f);
  uVar1 = ten_kappa - 1;
  rest_00 = local_50.f & uVar1;
  uVar2 = 1000000000;
  iVar6 = 9;
  do {
    if (iVar6 == -1) {
      lVar5 = 1;
      iVar6 = 0;
      do {
        uVar4 = rest_00 * 10 >> (bVar3 & 0x3f);
        if ((uVar4 & 0xffffffff) != 0 || buffer->_M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (buffer,(char)uVar4 + '0');
        }
        delta_00 = delta_00 * 10;
        lVar5 = lVar5 * 10;
        rest_00 = rest_00 * 10 & uVar1;
        iVar6 = iVar6 + -1;
      } while (delta_00 <= rest_00);
      *K = *K + iVar6;
      grisu_round(buffer,delta_00,rest_00,ten_kappa,lVar5 * DVar7.f);
      return;
    }
    if ((uVar2 <= (uint)uVar4) || (buffer->_M_string_length != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (buffer,(char)((uVar4 & 0xffffffff) / (ulong)uVar2) + '0');
    }
    uVar4 = (uVar4 & 0xffffffff) % (ulong)uVar2;
    rest = (uVar4 << (bVar3 & 0x3f)) + rest_00;
    if (delta_00 < rest) {
      uVar2 = uVar2 / 10;
    }
    else {
      *K = *K + iVar6;
      grisu_round(buffer,delta_00,rest,(ulong)uVar2 << (bVar3 & 0x3f),DVar7.f);
    }
    iVar6 = iVar6 + -1;
  } while (delta_00 < rest);
  return;
}

Assistant:

void digit_gen(DiyFp W, DiyFp Mp, DiyFp delta, std::string &buffer, int &K)
  {
    uint32_t div;
    int d, kappa;
    DiyFp one{((uint64_t) 1) << -Mp.e, Mp.e};
    DiyFp wp_w = Mp - W;
    uint32_t p1 = Mp.f >> -one.e;
    uint64_t p2 = Mp.f & (one.f - 1);
    kappa = 10;
    div = TEN9;
    while (kappa > 0)
    {
      d = static_cast<int>(p1 / div);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p1 %= div;
      kappa--;
      uint64_t tmp = (((uint64_t) p1) << -one.e) + p2;
      if (tmp <= delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, tmp, ((uint64_t) div) << -one.e, wp_w.f);
        return;
      }
      div /= 10;
    }
    uint64_t unit = 1;
    while (true)
    {
      p2 *= 10;
      delta.f *= 10;
      unit *= 10;
      d = static_cast<int>(p2 >> -one.e);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p2 &= one.f - 1;
      kappa--;
      if (p2 < delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, p2, one.f, wp_w.f * unit);
        return;
      }
    }
  }